

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_f773b::VersionPrinter::print(VersionPrinter *this)

{
  bool bVar1;
  raw_ostream *prVar2;
  string local_68;
  StringRef local_48;
  undefined1 local_38 [8];
  string CPU;
  raw_ostream *OS;
  VersionPrinter *this_local;
  
  CPU.field_2._8_8_ = llvm::outs();
  llvm::raw_ostream::operator<<((raw_ostream *)CPU.field_2._8_8_,"LLVM (http://llvm.org/):\n  ");
  prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)CPU.field_2._8_8_,"LLVM");
  prVar2 = llvm::raw_ostream::operator<<(prVar2," version ");
  llvm::raw_ostream::operator<<(prVar2,"7.0.0svn");
  llvm::raw_ostream::operator<<((raw_ostream *)CPU.field_2._8_8_,"\n  ");
  llvm::raw_ostream::operator<<((raw_ostream *)CPU.field_2._8_8_,"DEBUG build");
  llvm::raw_ostream::operator<<((raw_ostream *)CPU.field_2._8_8_," with assertions");
  local_48 = llvm::sys::getHostCPUName();
  llvm::StringRef::operator_cast_to_string((string *)local_38,&local_48);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"generic");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_38,"(unknown)");
  }
  prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)CPU.field_2._8_8_,".\n");
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"  Default target: ");
  llvm::sys::getDefaultTargetTriple_abi_cxx11_();
  prVar2 = llvm::raw_ostream::operator<<(prVar2,&local_68);
  prVar2 = llvm::raw_ostream::operator<<(prVar2,'\n');
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"  Host CPU: ");
  llvm::raw_ostream::operator<<(prVar2,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_68);
  llvm::raw_ostream::operator<<((raw_ostream *)CPU.field_2._8_8_,'\n');
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void print() {
    raw_ostream &OS = outs();
#ifdef PACKAGE_VENDOR
    OS << PACKAGE_VENDOR << " ";
#else
    OS << "LLVM (http://llvm.org/):\n  ";
#endif
    OS << PACKAGE_NAME << " version " << PACKAGE_VERSION;
#ifdef LLVM_VERSION_INFO
    OS << " " << LLVM_VERSION_INFO;
#endif
    OS << "\n  ";
#ifndef __OPTIMIZE__
    OS << "DEBUG build";
#else
    OS << "Optimized build";
#endif
#ifndef NDEBUG
    OS << " with assertions";
#endif
#if LLVM_VERSION_PRINTER_SHOW_HOST_TARGET_INFO
    std::string CPU = sys::getHostCPUName();
    if (CPU == "generic")
      CPU = "(unknown)";
    OS << ".\n"
       << "  Default target: " << sys::getDefaultTargetTriple() << '\n'
       << "  Host CPU: " << CPU;
#endif
    OS << '\n';
  }